

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O3

Action __thiscall
psy::C::TypeCanonicalizer::visitDeclarator_COMMON(TypeCanonicalizer *this,DeclaratorSyntax *node)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  int iVar3;
  Symbol *this_00;
  MIXIN_TypeableDeclarationSymbol *pMVar4;
  undefined4 extraout_var;
  Scope *pSVar5;
  Type *pTVar6;
  undefined4 extraout_var_00;
  ostream *poVar7;
  
  this_00 = &SemanticModel::declarationBy(this->semaModel_,node)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar3 = 0x78;
  }
  else {
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
    if (DVar1 < Type) {
      pMVar4 = MIXIN_TypeableDeclarationSymbol::from((DeclarationSymbol *)this_00);
      if (pMVar4 != (MIXIN_TypeableDeclarationSymbol *)0x0) {
        iVar3 = (*pMVar4->_vptr_MIXIN_TypeableDeclarationSymbol[2])(pMVar4);
        pSVar5 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
        pTVar6 = canonicalize(this,(Type *)CONCAT44(extraout_var,iVar3),pSVar5);
        (*pMVar4->_vptr_MIXIN_TypeableDeclarationSymbol[3])(pMVar4,pTVar6);
        return Skip;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                 ,0x60);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      iVar3 = 0x85;
    }
    else {
      if (DVar1 != Type) {
        return Skip;
      }
      SVar2 = Symbol::kind(this_00);
      if (SVar2 == TypedefDeclaration) {
        iVar3 = (*this_00->_vptr_Symbol[0x22])(this_00);
        pTVar6 = TypedefDeclarationSymbol::synonymizedType
                           ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar3));
        pSVar5 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
        pTVar6 = canonicalize(this,pTVar6,pSVar5);
        TypedefDeclarationSymbol::setSynonymizedType
                  ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar3),pTVar6);
        return Skip;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                 ,0x60);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      iVar3 = 0x7b;
    }
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return Quit;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitDeclarator_COMMON(const DeclaratorSyntax* node)
{
    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    switch (decl->category()) {
        case DeclarationCategory::Type: {
            PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
            auto tydefDecl = decl->asTypedefDeclaration();
            auto canonTy = canonicalize(tydefDecl->synonymizedType(), decl->enclosingScope());
            tydefDecl->setSynonymizedType(canonTy);
            break;
        }
        case DeclarationCategory::Member:
        case DeclarationCategory::Function:
        case DeclarationCategory::Object: {
            auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
            PSY_ASSERT_2(typeableDecl, return Action::Quit);
            auto ty = typeableDecl->type();
            auto canonTy = canonicalize(ty, decl->enclosingScope());
            typeableDecl->setType(canonTy);
            break;
        }
    }

    return Action::Skip;
}